

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_remotes.hpp
# Opt level: O0

void __thiscall Omega_h::Remotes::~Remotes(Remotes *this)

{
  Remotes *this_local;
  
  Read<int>::~Read((Read<int> *)(this + 0x10));
  Read<int>::~Read((Read<int> *)this);
  return;
}

Assistant:

Remotes() {}